

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForInObjectEnumerator.cpp
# Opt level: O1

RecyclableObject *
Js::ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
          (RecyclableObject *object,RecyclableObject **pFirstPrototype)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DynamicObject *this;
  RecyclableObject *pRVar6;
  
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00b57977;
    *puVar5 = 0;
  }
  TVar1 = ((object->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(object), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) {
LAB_00b57977:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (TVar1 == TypeIds_HostDispatch) {
    pRVar6 = (RecyclableObject *)0x0;
LAB_00b5789b:
    object = (RecyclableObject *)0x0;
  }
  else {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pRVar6 = (RecyclableObject *)0x0;
    do {
      object = RecyclableObject::GetPrototype(object);
      if (object == (RecyclableObject *)0x0) goto LAB_00b5789b;
      TVar1 = ((object->type).ptr)->typeId;
      if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(object), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00b57977;
        *puVar5 = 0;
      }
      if (TVar1 == TypeIds_Null) goto LAB_00b5789b;
      if (pRVar6 == (RecyclableObject *)0x0) {
        pRVar6 = object;
      }
      bVar3 = DynamicType::Is(((object->type).ptr)->typeId);
      if (!bVar3) break;
      this = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
      bVar3 = DynamicObject::GetHasNoEnumerableProperties(this);
    } while (bVar3);
  }
  if (pFirstPrototype != (RecyclableObject **)0x0) {
    *pFirstPrototype = pRVar6;
  }
  return object;
}

Assistant:

RecyclableObject* ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(RecyclableObject* object, RecyclableObject** pFirstPrototype)
    {
        RecyclableObject* firstPrototype = nullptr;
        RecyclableObject* firstPrototypeWithEnumerableProperties = nullptr;

        if (JavascriptOperators::GetTypeId(object) != TypeIds_HostDispatch)
        {
            firstPrototypeWithEnumerableProperties = object;
            while (true)
            {
                firstPrototypeWithEnumerableProperties = firstPrototypeWithEnumerableProperties->GetPrototype();

                if (firstPrototypeWithEnumerableProperties == nullptr)
                {
                    break;
                }

                if (JavascriptOperators::GetTypeId(firstPrototypeWithEnumerableProperties) == TypeIds_Null)
                {
                    firstPrototypeWithEnumerableProperties = nullptr;
                    break;
                }

                if (firstPrototype == nullptr)
                {
                    firstPrototype = firstPrototypeWithEnumerableProperties;
                }

                if (!DynamicType::Is(firstPrototypeWithEnumerableProperties->GetTypeId())
                    || !UnsafeVarTo<DynamicObject>(firstPrototypeWithEnumerableProperties)->GetHasNoEnumerableProperties())
                {
                    break;
                }
            }
        }

        if (pFirstPrototype != nullptr)
        {
            *pFirstPrototype = firstPrototype;
        }

        return firstPrototypeWithEnumerableProperties;
    }